

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O0

int __thiscall SimpleLogger::LogElem::flush(LogElem *this,ofstream *fs)

{
  bool bVar1;
  char *in_RSI;
  long in_RDI;
  atomic<SimpleLogger::LogElem::Status> *unaff_retaddr;
  Status val;
  Status exp;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  bVar1 = std::atomic<SimpleLogger::LogElem::Status>::compare_exchange_strong
                    (unaff_retaddr,
                     (Status *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                     (Status)((ulong)in_RDI >> 0x20),(memory_order)in_RDI);
  if (bVar1) {
    std::ostream::write(in_RSI,in_RDI + 8);
    std::atomic<SimpleLogger::LogElem::Status>::store
              ((atomic<SimpleLogger::LogElem::Status> *)(in_RDI + 0x1008),CLEAN,memory_order_seq_cst
              );
    iVar2 = 0;
  }
  else {
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int SimpleLogger::LogElem::flush(std::ofstream& fs) {
    Status exp = DIRTY;
    Status val = FLUSHING;
    if (!status.compare_exchange_strong(exp, val)) return -1;

    fs.write(ctx, len);

    status.store(LogElem::CLEAN);
    return 0;
}